

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O0

string * read_file(string *__return_storage_ptr__,string *file_name)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  istream *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined4 local_258;
  istream local_248 [8];
  ifstream infile;
  undefined1 local_38 [8];
  string tmp;
  string *file_name_local;
  string *file_content;
  
  tmp.field_2._8_8_ = file_name;
  std::__cxx11::string::string((string *)local_38);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::ifstream::ifstream(local_248);
  _Var3 = std::__cxx11::string::c_str();
  std::ifstream::open((char *)local_248,_Var3);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_248,(string *)local_38);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) break;
      std::operator+(&local_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                     anon_var_dwarf_50e7 + 0x2b);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_278);
      std::__cxx11::string::~string((string *)&local_278);
    }
    std::ifstream::close();
  }
  local_258 = 1;
  std::ifstream::~ifstream(local_248);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string read_file(const std::string &file_name) {
    std::string tmp;
    std::string file_content;
    std::ifstream infile;

    infile.open(file_name.c_str(), std::ifstream::binary);

    if (!infile.is_open()) {
        return file_content;
    }

    // 以 '\n' 作为分行标识
    while (getline(infile, tmp))
        file_content += tmp + "\n";

    infile.close();

    return file_content;
}